

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_crt_verify_child
              (mbedtls_x509_crt *child,mbedtls_x509_crt *parent,mbedtls_x509_crt *trust_ca,
              mbedtls_x509_crl *ca_crl,mbedtls_x509_crt_profile *profile,int path_cnt,int self_cnt,
              uint32_t *flags,_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *f_vrfy,
              void *p_vrfy)

{
  mbedtls_pk_type_t type;
  mbedtls_md_type_t md_alg;
  void *options;
  byte bVar1;
  int iVar2;
  uint uVar3;
  mbedtls_md_info_t *md_info_00;
  mbedtls_pk_context *ctx;
  mbedtls_md_info_t *md_info;
  mbedtls_x509_crt *grandparent;
  uchar hash [64];
  uint32_t local_4c [2];
  uint32_t parent_flags;
  int ret;
  int path_cnt_local;
  mbedtls_x509_crt_profile *profile_local;
  mbedtls_x509_crl *ca_crl_local;
  mbedtls_x509_crt *trust_ca_local;
  mbedtls_x509_crt *parent_local;
  mbedtls_x509_crt *child_local;
  
  local_4c[0] = 0;
  parent_flags = path_cnt;
  _ret = profile;
  profile_local = (mbedtls_x509_crt_profile *)ca_crl;
  ca_crl_local = (mbedtls_x509_crl *)trust_ca;
  trust_ca_local = parent;
  parent_local = child;
  if ((path_cnt != 0) && (iVar2 = x509_name_cmp(&child->issuer,&child->subject), iVar2 == 0)) {
    self_cnt = self_cnt + 1;
  }
  if ((int)(parent_flags + 1) < 9) {
    iVar2 = mbedtls_x509_time_is_past(&parent_local->valid_to);
    if (iVar2 != 0) {
      *flags = *flags | 1;
    }
    iVar2 = mbedtls_x509_time_is_future(&parent_local->valid_from);
    if (iVar2 != 0) {
      *flags = *flags | 0x200;
    }
    iVar2 = x509_profile_check_md_alg(_ret,parent_local->sig_md);
    if (iVar2 != 0) {
      *flags = *flags | 0x4000;
    }
    iVar2 = x509_profile_check_pk_alg(_ret,parent_local->sig_pk);
    if (iVar2 != 0) {
      *flags = *flags | 0x8000;
    }
    md_info_00 = mbedtls_md_info_from_type(parent_local->sig_md);
    if (md_info_00 == (mbedtls_md_info_t *)0x0) {
      *flags = *flags | 8;
    }
    else {
      mbedtls_md(md_info_00,(parent_local->tbs).p,(parent_local->tbs).len,(uchar *)&grandparent);
      iVar2 = x509_profile_check_key(_ret,parent_local->sig_pk,&trust_ca_local->pk);
      if (iVar2 != 0) {
        *flags = *flags | 0x10000;
      }
      type = parent_local->sig_pk;
      options = parent_local->sig_opts;
      ctx = &trust_ca_local->pk;
      md_alg = parent_local->sig_md;
      bVar1 = mbedtls_md_get_size(md_info_00);
      iVar2 = mbedtls_pk_verify_ext
                        (type,options,ctx,md_alg,(uchar *)&grandparent,(ulong)bVar1,
                         (parent_local->sig).p,(parent_local->sig).len);
      if (iVar2 != 0) {
        *flags = *flags | 8;
      }
    }
    uVar3 = x509_crt_verifycrl(parent_local,trust_ca_local,(mbedtls_x509_crl *)profile_local,_ret);
    *flags = uVar3 | *flags;
    md_info = (mbedtls_md_info_t *)ca_crl_local;
    while ((md_info != (mbedtls_md_info_t *)0x0 &&
           (iVar2 = x509_crt_check_parent
                              (trust_ca_local,(mbedtls_x509_crt *)md_info,0,
                               (uint)(parent_flags == 0)), iVar2 != 0))) {
      md_info = *(mbedtls_md_info_t **)&md_info[6].size;
    }
    if (md_info == (mbedtls_md_info_t *)0x0) {
      md_info = (mbedtls_md_info_t *)trust_ca_local->next;
      while ((md_info != (mbedtls_md_info_t *)0x0 &&
             (((0 < md_info[5].size && (md_info[5].size < (int)((parent_flags + 2) - self_cnt))) ||
              (iVar2 = x509_crt_check_parent
                                 (trust_ca_local,(mbedtls_x509_crt *)md_info,0,
                                  (uint)(parent_flags == 0)), iVar2 != 0))))) {
        md_info = *(mbedtls_md_info_t **)&md_info[6].size;
      }
      if (md_info == (mbedtls_md_info_t *)0x0) {
        child_local._4_4_ =
             x509_crt_verify_top(trust_ca_local,(mbedtls_x509_crt *)ca_crl_local,
                                 (mbedtls_x509_crl *)profile_local,_ret,parent_flags + 1,self_cnt,
                                 local_4c,f_vrfy,p_vrfy);
      }
      else {
        child_local._4_4_ =
             x509_crt_verify_child
                       (trust_ca_local,(mbedtls_x509_crt *)md_info,(mbedtls_x509_crt *)ca_crl_local,
                        (mbedtls_x509_crl *)profile_local,_ret,parent_flags + 1,self_cnt,local_4c,
                        f_vrfy,p_vrfy);
      }
    }
    else {
      child_local._4_4_ =
           x509_crt_verify_top(trust_ca_local,(mbedtls_x509_crt *)md_info,
                               (mbedtls_x509_crl *)profile_local,_ret,parent_flags + 1,self_cnt,
                               local_4c,f_vrfy,p_vrfy);
    }
    if ((child_local._4_4_ == 0) &&
       ((local_4c[1] = 0, f_vrfy == (_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *)0x0
        || (child_local._4_4_ = (*f_vrfy)(p_vrfy,parent_local,parent_flags,flags),
           child_local._4_4_ == 0)))) {
      *flags = local_4c[0] | *flags;
      child_local._4_4_ = 0;
    }
  }
  else {
    *flags = *flags | 8;
    child_local._4_4_ = -0x2700;
  }
  return child_local._4_4_;
}

Assistant:

static int x509_crt_verify_child(
                mbedtls_x509_crt *child, mbedtls_x509_crt *parent,
                mbedtls_x509_crt *trust_ca, mbedtls_x509_crl *ca_crl,
                const mbedtls_x509_crt_profile *profile,
                int path_cnt, int self_cnt, uint32_t *flags,
                int (*f_vrfy)(void *, mbedtls_x509_crt *, int, uint32_t *),
                void *p_vrfy )
{
    int ret;
    uint32_t parent_flags = 0;
    unsigned char hash[MBEDTLS_MD_MAX_SIZE];
    mbedtls_x509_crt *grandparent;
    const mbedtls_md_info_t *md_info;

    /* Counting intermediate self signed certificates */
    if( ( path_cnt != 0 ) && x509_name_cmp( &child->issuer, &child->subject ) == 0 )
        self_cnt++;

    /* path_cnt is 0 for the first intermediate CA */
    if( 1 + path_cnt > MBEDTLS_X509_MAX_INTERMEDIATE_CA )
    {
        *flags |= MBEDTLS_X509_BADCERT_NOT_TRUSTED;
        return( MBEDTLS_ERR_X509_CERT_VERIFY_FAILED );
    }

    if( mbedtls_x509_time_is_past( &child->valid_to ) )
        *flags |= MBEDTLS_X509_BADCERT_EXPIRED;

    if( mbedtls_x509_time_is_future( &child->valid_from ) )
        *flags |= MBEDTLS_X509_BADCERT_FUTURE;

    if( x509_profile_check_md_alg( profile, child->sig_md ) != 0 )
        *flags |= MBEDTLS_X509_BADCERT_BAD_MD;

    if( x509_profile_check_pk_alg( profile, child->sig_pk ) != 0 )
        *flags |= MBEDTLS_X509_BADCERT_BAD_PK;

    md_info = mbedtls_md_info_from_type( child->sig_md );
    if( md_info == NULL )
    {
        /*
         * Cannot check 'unknown' hash
         */
        *flags |= MBEDTLS_X509_BADCERT_NOT_TRUSTED;
    }
    else
    {
        mbedtls_md( md_info, child->tbs.p, child->tbs.len, hash );

        if( x509_profile_check_key( profile, child->sig_pk, &parent->pk ) != 0 )
            *flags |= MBEDTLS_X509_BADCERT_BAD_KEY;

        if( mbedtls_pk_verify_ext( child->sig_pk, child->sig_opts, &parent->pk,
                           child->sig_md, hash, mbedtls_md_get_size( md_info ),
                           child->sig.p, child->sig.len ) != 0 )
        {
            *flags |= MBEDTLS_X509_BADCERT_NOT_TRUSTED;
        }
    }

#if defined(MBEDTLS_X509_CRL_PARSE_C)
    /* Check trusted CA's CRL for the given crt */
    *flags |= x509_crt_verifycrl(child, parent, ca_crl, profile );
#endif

    /* Look for a grandparent in trusted CAs */
    for( grandparent = trust_ca;
         grandparent != NULL;
         grandparent = grandparent->next )
    {
        if( x509_crt_check_parent( parent, grandparent,
                                   0, path_cnt == 0 ) == 0 )
            break;
    }

    if( grandparent != NULL )
    {
        ret = x509_crt_verify_top( parent, grandparent, ca_crl, profile,
                                path_cnt + 1, self_cnt, &parent_flags, f_vrfy, p_vrfy );
        if( ret != 0 )
            return( ret );
    }
    else
    {
        /* Look for a grandparent upwards the chain */
        for( grandparent = parent->next;
             grandparent != NULL;
             grandparent = grandparent->next )
        {
            /* +2 because the current step is not yet accounted for
             * and because max_pathlen is one higher than it should be.
             * Also self signed certificates do not count to the limit. */
            if( grandparent->max_pathlen > 0 &&
                grandparent->max_pathlen < 2 + path_cnt - self_cnt )
            {
                continue;
            }

            if( x509_crt_check_parent( parent, grandparent,
                                       0, path_cnt == 0 ) == 0 )
                break;
        }

        /* Is our parent part of the chain or at the top? */
        if( grandparent != NULL )
        {
            ret = x509_crt_verify_child( parent, grandparent, trust_ca, ca_crl,
                                         profile, path_cnt + 1, self_cnt, &parent_flags,
                                         f_vrfy, p_vrfy );
            if( ret != 0 )
                return( ret );
        }
        else
        {
            ret = x509_crt_verify_top( parent, trust_ca, ca_crl, profile,
                                       path_cnt + 1, self_cnt, &parent_flags,
                                       f_vrfy, p_vrfy );
            if( ret != 0 )
                return( ret );
        }
    }

    /* child is verified to be a child of the parent, call verify callback */
    if( NULL != f_vrfy )
        if( ( ret = f_vrfy( p_vrfy, child, path_cnt, flags ) ) != 0 )
            return( ret );

    *flags |= parent_flags;

    return( 0 );
}